

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O1

void __thiscall UnitDefinitions_mass2weight_Test::TestBody(UnitDefinitions_mass2weight_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  result;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  double unaff_RBX;
  pointer *__ptr;
  char *pcVar1;
  AssertionResult AVar2;
  double unaff_retaddr;
  char *in_stack_00000008;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffd8;
  AssertHelper local_20;
  char local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  units::convert<units::unit,units::unit>(1.0,(unit *)&units::N,(unit *)&units::kg);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd8._M_head_impl,(char *)0x1374de,in_stack_00000008,
             unaff_retaddr,unaff_RBX,(double)in_stack_fffffffffffffff0);
  if (local_18 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x2c0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (in_stack_ffffffffffffffd8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd8._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  units::convert<units::unit,units::unit>(1.0,(unit *)&units::kg,(unit *)&units::N);
  AVar2 = testing::internal::DoubleNearPredFormat
                    ((char *)in_stack_ffffffffffffffd8._M_head_impl,(char *)0x1375a3,
                     in_stack_00000008,unaff_retaddr,unaff_RBX,(double)in_stack_fffffffffffffff0);
  result._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar2.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_18 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x2c1,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    result = extraout_RDX.
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffffd8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd8._M_head_impl + 8))();
      result._M_head_impl = extraout_RDX_00;
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
    result._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_01.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  units::convert<units::precise_unit,units::unit>
            ((units *)units::precise::lbf,1.0,(precise_unit *)&units::kg,(unit *)result._M_head_impl
            );
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd8._M_head_impl,(char *)0x137668,in_stack_00000008,
             unaff_retaddr,unaff_RBX,(double)in_stack_fffffffffffffff0);
  if (local_18 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x2c3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )in_stack_ffffffffffffffd8._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd8._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

TEST(UnitDefinitions, mass2weight)
{
    using namespace units;
    EXPECT_NEAR(convert(1.0, N, kg), 0.101971621, test::tolerance);
    EXPECT_NEAR(convert(1.0, kg, N), constants::g0.value(), test::tolerance);

    EXPECT_NEAR(convert(1.0, precise::lbf, kg), 0.45359237, test::tolerance);
}